

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tl.cpp
# Opt level: O0

void __thiscall pg::TLSolver::TLSolver(TLSolver *this,Oink *oink,Game *game)

{
  Game *game_local;
  Oink *oink_local;
  TLSolver *this_local;
  
  Solver::Solver(&this->super_Solver,oink,game);
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__TLSolver_0029ca90;
  this->iterations = 0;
  this->dominions = 0;
  this->tangles = 0;
  this->steps = 0;
  std::vector<int_*,_std::allocator<int_*>_>::vector(&this->tout);
  std::vector<int_*,_std::allocator<int_*>_>::vector(&this->tv);
  std::vector<int,_std::allocator<int>_>::vector(&this->tpr);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->tescs);
  uintqueue::uintqueue(&this->Q);
  uintqueue::uintqueue(&this->pea_state);
  uintqueue::uintqueue(&this->pea_S);
  bitset::bitset(&this->pea_root);
  std::vector<int,_std::allocator<int>_>::vector(&this->tangle);
  uintqueue::uintqueue(&this->tangleto);
  bitset::bitset(&this->escapes);
  bitset::bitset(&this->R);
  bitset::bitset(&this->Z);
  bitset::bitset(&this->G);
  bitset::bitset(&this->S);
  bitset::bitset(&this->V);
  bitset::bitset(&this->W);
  bitset::bitset(&this->Even);
  bitset::bitset(&this->Odd);
  return;
}

Assistant:

TLSolver::TLSolver(Oink& oink, Game& game) : Solver(oink, game)
{
}